

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  u8 eMode;
  ushort uVar1;
  sqlite3 *db;
  Select *pSVar2;
  Schema *pSVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Table *pTab;
  Trigger *pTVar10;
  Vdbe *p;
  undefined4 extraout_var;
  WhereInfo *pWVar11;
  ulong uVar12;
  Index *pIVar13;
  char *pcVar14;
  undefined4 extraout_var_00;
  Parse *pPVar15;
  int p2;
  Schema **ppSVar16;
  Op *pOVar17;
  VTable *zP4;
  uint uVar18;
  int op;
  Expr *pLimit_00;
  int in_R9D;
  Parse *pPVar19;
  u8 *aToOpen;
  ulong uVar20;
  bool bVar21;
  uint local_f8;
  int iDataCur;
  WhereInfo *local_c0;
  ulong local_b8;
  char *local_b0;
  ulong local_a8;
  int local_a0;
  int iIdxCur;
  Index *local_98;
  ulong local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  Trigger *local_70;
  NameContext sNC;
  
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  if ((pParse->nErr != 0) || (db->mallocFailed != '\0')) {
    pPVar19 = (Parse *)0x0;
    aToOpen = (u8 *)0x0;
    pcVar14 = (char *)0x0;
    goto LAB_001493be;
  }
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab != (Table *)0x0) {
    pTVar10 = sqlite3TriggersExist(pParse,pTab,0x75,(ExprList *)0x0,(int *)0x0);
    pSVar2 = pTab->pSelect;
    bVar21 = true;
    if (pTVar10 == (Trigger *)0x0) {
      iVar5 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
      bVar21 = iVar5 != 0;
    }
    iVar5 = sqlite3ViewGetColumnNames(pParse,pTab);
    if ((iVar5 == 0) &&
       (iVar5 = sqlite3IsReadOnly(pParse,pTab,(uint)(pTVar10 != (Trigger *)0x0)), iVar5 == 0)) {
      if (pTab->pSchema == (Schema *)0x0) {
        iVar5 = -1000000;
      }
      else {
        iVar5 = -1;
        ppSVar16 = &db->aDb->pSchema;
        do {
          iVar5 = iVar5 + 1;
          pSVar3 = *ppSVar16;
          ppSVar16 = ppSVar16 + 4;
        } while (pSVar3 != pTab->pSchema);
      }
      pLimit_00 = (Expr *)db->aDb[iVar5].zDbSName;
      local_90 = 0;
      local_70 = pTVar10;
      iVar6 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,(char *)pLimit_00);
      pPVar19 = (Parse *)0x0;
      aToOpen = (u8 *)0x0;
      pcVar14 = (char *)0x0;
      if (iVar6 == 1) goto LAB_001493be;
      uVar8 = pParse->nTab;
      local_a8 = (ulong)uVar8;
      pParse->nTab = uVar8 + 1;
      pTabList->a[0].iCursor = uVar8;
      pIVar13 = pTab->pIndex;
      if (pIVar13 != (Index *)0x0) {
        local_90 = 0;
        do {
          uVar18 = (int)local_90 + 1;
          local_90 = (ulong)uVar18;
          pIVar13 = pIVar13->pNext;
        } while (pIVar13 != (Index *)0x0);
        pParse->nTab = pParse->nTab + uVar18;
      }
      if (pSVar2 == (Select *)0x0) {
        pPVar19 = (Parse *)0x0;
        local_b0 = (char *)0x0;
      }
      else {
        local_b0 = pParse->zAuthContext;
        pParse->zAuthContext = pTab->zName;
        pPVar19 = pParse;
      }
      p = sqlite3GetVdbe(pParse);
      if (p != (Vdbe *)0x0) {
        if (pParse->nested == '\0') {
          p->field_0xc1 = p->field_0xc1 | 0x20;
        }
        sqlite3BeginWriteOperation(pParse,(uint)bVar21,iVar5);
        if (pSVar2 != (Select *)0x0) {
          iVar7 = (int)local_a8;
          sqlite3MaterializeView
                    (pParse,pTab,pWhere,(ExprList *)(local_a8 & 0xffffffff),pLimit_00,in_R9D);
          iDataCur = iVar7;
          iIdxCur = iVar7;
        }
        sNC.nRef = 0;
        sNC.nErr = 0;
        sNC.ncFlags = 0;
        sNC._42_6_ = 0;
        sNC.uNC.pEList = (ExprList *)0x0;
        sNC.pNext = (NameContext *)0x0;
        sNC.pWinSelect = (Select *)0x0;
        sNC.pParse = pParse;
        sNC.pSrcList = pTabList;
        iVar7 = sqlite3ResolveExprNames(&sNC,pWhere);
        if (iVar7 == 0) {
          if ((db->flags & 0x80) == 0) {
            local_f8 = 0;
          }
          else if (pParse->nested == '\0') {
            local_f8 = 0;
            if (pParse->pTriggerTab == (Table *)0x0) {
              local_f8 = pParse->nMem + 1;
              pParse->nMem = local_f8;
              sqlite3VdbeAddOp3(p,0x46,0,local_f8,0);
            }
          }
          else {
            local_f8 = 0;
          }
          if (((pWhere == (Expr *)0x0 && iVar6 == 0) && bVar21 == false) && (pTab->nModuleArg == 0))
          {
            sqlite3TableLock(pParse,iVar5,pTab->tnum,'\x01',pTab->zName);
            if ((pTab->tabFlags & 0x20) == 0) {
              pcVar14 = pTab->zName;
              iVar6 = sqlite3VdbeAddOp3(p,0x8a,pTab->tnum,iVar5,-(uint)(local_f8 == 0) | local_f8);
              sqlite3VdbeChangeP4(p,iVar6,pcVar14,-1);
            }
            aToOpen = (u8 *)0x0;
            for (pIVar13 = pTab->pIndex; pIVar13 != (Index *)0x0; pIVar13 = pIVar13->pNext) {
              sqlite3VdbeAddOp3(p,0x8a,pIVar13->tnum,iVar5,0);
            }
          }
          else {
            uVar12 = sNC._40_8_ & 0x40;
            if ((pTab->tabFlags & 0x20) == 0) {
              local_a0 = pParse->nMem + 1;
              pParse->nMem = local_a0;
              local_98 = (Index *)0x0;
              iVar5 = sqlite3VdbeAddOp3(p,0x49,0,local_a0,0);
              local_b8 = CONCAT62((int6)(CONCAT44(extraout_var,iVar5) >> 0x10),1);
              iVar5 = 0;
              iVar6 = 0;
              local_84 = 0;
            }
            else {
              for (pIVar13 = pTab->pIndex;
                  (pIVar13 != (Index *)0x0 && ((*(ushort *)&pIVar13->field_0x63 & 3) != 2));
                  pIVar13 = pIVar13->pNext) {
              }
              uVar1 = pIVar13->nKeyCol;
              local_b8 = (ulong)uVar1;
              iVar6 = pParse->nTab;
              iVar5 = pParse->nMem + 1;
              pParse->nMem = pParse->nMem + (int)(short)uVar1;
              pParse->nTab = iVar6 + 1;
              local_a0 = 0;
              local_84 = sqlite3VdbeAddOp3(p,0x71,iVar6,(int)(short)uVar1,0);
              local_98 = pIVar13;
              sqlite3VdbeSetP4KeyInfo(pParse,pIVar13);
            }
            aToOpen = (u8 *)0x0;
            pWVar11 = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,
                                        (ushort)(uVar12 == 0 & (bVar21 ^ 1U)) * 8 + 0x414,uVar8 + 1)
            ;
            if (pWVar11 == (WhereInfo *)0x0) {
              bVar21 = false;
            }
            else {
              local_78 = *(ulong *)pWVar11->aiCurOnePass;
              eMode = pWVar11->eOnePass;
              if (eMode != '\x01') {
                pPVar15 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar15 = pParse;
                }
                pPVar15->isMultiWrite = '\x01';
              }
              local_c0 = pWVar11;
              if (local_f8 != 0) {
                sqlite3VdbeAddOp3(p,0x53,local_f8,1,0);
              }
              pIVar13 = local_98;
              local_80 = local_78 >> 0x20;
              if (local_98 == (Index *)0x0) {
                iVar7 = pParse->nMem + 1;
                pParse->nMem = iVar7;
                sqlite3VdbeAddOp3(p,0x81,(int)local_a8,iVar7,0);
              }
              else {
                iVar7 = iVar5;
                if (0 < (short)local_b8) {
                  uVar12 = local_b8 & 0xffff;
                  uVar20 = 0;
                  do {
                    sqlite3ExprCodeGetColumnOfTable
                              (p,pTab,(int)local_a8,(int)pIVar13->aiColumn[uVar20],
                               iVar5 + (int)uVar20);
                    uVar20 = uVar20 + 1;
                  } while (uVar12 != uVar20);
                }
              }
              uVar12 = local_90;
              if (eMode == '\0') {
                if (local_98 == (Index *)0x0) {
                  aToOpen = (u8 *)0x0;
                  iVar5 = sqlite3VdbeAddOp3(p,0x95,local_a0,iVar7,0);
                  local_b8 = CONCAT62((int6)(CONCAT44(extraout_var_00,iVar5) >> 0x10),1);
                }
                else {
                  iVar7 = pParse->nMem + 1;
                  pParse->nMem = iVar7;
                  iVar9 = (int)(short)local_b8;
                  local_90 = CONCAT44(local_90._4_4_,iVar9);
                  pcVar14 = sqlite3IndexAffinityStr(pParse->db,local_98);
                  iVar9 = sqlite3VdbeAddOp3(p,0x66,iVar5,iVar9,iVar7);
                  sqlite3VdbeChangeP4(p,iVar9,pcVar14,(int)local_90);
                  iVar5 = sqlite3VdbeAddOp3(p,0x85,iVar6,iVar7,iVar5);
                  if (p->db->mallocFailed == '\0') {
                    pOVar17 = p->aOp;
                    pOVar17[iVar5].p4type = -3;
                    pOVar17[iVar5].p4.i = (int)local_90;
                  }
                  aToOpen = (u8 *)0x0;
                  local_b8 = 0;
                }
              }
              else {
                aToOpen = (u8 *)sqlite3DbMallocRawNN(db,(ulong)((int)local_90 + 2));
                if (aToOpen == (u8 *)0x0) {
                  sqlite3WhereEnd(local_c0);
                  aToOpen = (u8 *)0x0;
                  bVar21 = false;
                  goto LAB_00149f2c;
                }
                memset(aToOpen,1,(uVar12 & 0xffffffff) + 1);
                aToOpen[(uVar12 & 0xffffffff) + 1] = '\0';
                if (-1 < (int)local_78) {
                  aToOpen[(int)local_78 - (int)local_a8] = '\0';
                }
                if (-1 < (long)local_78) {
                  aToOpen[(int)local_80 - (int)local_a8] = '\0';
                }
                if (local_84 != 0) {
                  sqlite3VdbeChangeToNoop(p,local_84);
                }
              }
              if (eMode == '\0') {
                sqlite3WhereEnd(local_c0);
                uVar8 = 0;
              }
              else {
                uVar8 = sqlite3VdbeMakeLabel(p);
              }
              if (pSVar2 == (Select *)0x0) {
                iVar5 = 0;
                if (eMode == '\x02') {
                  iVar5 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
                }
                sqlite3OpenTableAndIndices
                          (pParse,pTab,0x6e,'\b',(int)local_a8,aToOpen,&iDataCur,&iIdxCur);
                if (eMode == '\x02') {
                  if (p->db->mallocFailed == '\0') {
                    iVar9 = p->nOp + -1;
                    if (-1 < iVar5) {
                      iVar9 = iVar5;
                    }
                    pOVar17 = p->aOp + iVar9;
                  }
                  else {
                    pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
                  }
                  pOVar17->p2 = p->nOp;
                }
              }
              if (eMode == '\0') {
                if (local_98 == (Index *)0x0) {
                  iVar5 = sqlite3VdbeAddOp3(p,0x29,local_a0,0,iVar7);
                }
                else {
                  iVar5 = sqlite3VdbeAddOp3(p,0x24,iVar6,0,0);
                  if (pTab->nModuleArg == 0) {
                    op = 0x80;
                    iVar9 = 0;
                    p2 = iVar7;
                  }
                  else {
                    op = 0x5a;
                    iVar9 = iVar7;
                    p2 = 0;
                  }
                  sqlite3VdbeAddOp3(p,op,iVar6,p2,iVar9);
                }
              }
              else if (pTab->nModuleArg == 0) {
                iVar5 = 0;
                if ((aToOpen[iDataCur - (int)local_a8] != '\0') &&
                   (iVar9 = sqlite3VdbeAddOp3(p,0x1c,iDataCur,uVar8,iVar7),
                   p->db->mallocFailed == '\0')) {
                  pOVar17 = p->aOp;
                  pOVar17[iVar9].p4type = -3;
                  *(int *)&pOVar17[iVar9].p4 = (int)(short)local_b8;
                }
              }
              else {
                iVar5 = 0;
              }
              if (pTab->nModuleArg == 0) {
                sqlite3GenerateRowDelete
                          (pParse,pTab,local_70,iDataCur,iIdxCur,iVar7,(short)local_b8,
                           pParse->nested == '\0','\v',eMode,(int)local_80);
              }
              else {
                for (zP4 = pTab->pVTable; (zP4 != (VTable *)0x0 && (zP4->db != db));
                    zP4 = zP4->pNext) {
                }
                sqlite3VtabMakeWritable(pParse,pTab);
                pPVar15 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar15 = pParse;
                }
                pPVar15->mayAbort = '\x01';
                if ((eMode == '\x01') &&
                   (sqlite3VdbeAddOp3(p,0x75,(int)local_a8,0,0), pParse->pToplevel == (Parse *)0x0))
                {
                  pParse->isMultiWrite = '\0';
                }
                iVar7 = sqlite3VdbeAddOp3(p,10,0,1,iVar7);
                sqlite3VdbeChangeP4(p,iVar7,(char *)zP4,-0xc);
                if (0 < (long)p->nOp) {
                  p->aOp[(long)p->nOp + -1].p5 = 2;
                }
              }
              if (eMode == '\0') {
                if (local_98 == (Index *)0x0) {
                  sqlite3VdbeAddOp3(p,0xb,0,iVar5,0);
                  if (p->db->mallocFailed == '\0') {
                    iVar6 = p->nOp + -1;
                    if (-1 < iVar5) {
                      iVar6 = iVar5;
                    }
                    pOVar17 = p->aOp + iVar6;
                  }
                  else {
                    pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
                  }
                  pOVar17->p2 = p->nOp;
                  bVar21 = true;
                  goto LAB_00149f2c;
                }
                sqlite3VdbeAddOp3(p,5,iVar6,iVar5 + 1,0);
                if (p->db->mallocFailed == '\0') {
                  iVar6 = p->nOp + -1;
                  if (-1 < iVar5) {
                    iVar6 = iVar5;
                  }
                  pOVar17 = p->aOp + iVar6;
                }
                else {
                  pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar17->p2 = p->nOp;
              }
              else {
                piVar4 = p->pParse->aLabel;
                if (piVar4 != (int *)0x0) {
                  piVar4[(int)~uVar8] = p->nOp;
                }
                sqlite3WhereEnd(local_c0);
              }
              bVar21 = true;
            }
LAB_00149f2c:
            pcVar14 = local_b0;
            if (!bVar21) goto LAB_001493be;
          }
          if (((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) &&
             (pParse->pAinc != (AutoincInfo *)0x0)) {
            autoIncrementEnd(pParse);
          }
          pcVar14 = local_b0;
          if (local_f8 != 0) {
            sqlite3VdbeAddOp3(p,0x51,local_f8,1,0);
            sqlite3VdbeSetNumCols(p,1);
            pcVar14 = local_b0;
            if (p->db->mallocFailed == '\0') {
              sqlite3VdbeMemSetStr(p->aColName,"rows deleted",-1,'\x01',(_func_void_void_ptr *)0x0);
              pcVar14 = local_b0;
            }
          }
          goto LAB_001493be;
        }
      }
      aToOpen = (u8 *)0x0;
      pcVar14 = local_b0;
      goto LAB_001493be;
    }
  }
  pPVar19 = (Parse *)0x0;
  aToOpen = (u8 *)0x0;
  pcVar14 = (char *)0x0;
LAB_001493be:
  if (pPVar19 != (Parse *)0x0) {
    pPVar19->zAuthContext = pcVar14;
  }
  sqlite3SrcListDelete(db,pTabList);
  if (pWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhere);
  }
  if (aToOpen != (u8 *)0x0) {
    sqlite3DbFreeNN(db,aToOpen);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */
 
#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto delete_from_cleanup;
  }
  assert( pTabList->nSrc==1 );


  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, (pTrigger?1:0)) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, 
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, 
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by 
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK|WHERE_SEEK_TABLE;
    if( sNC.ncFlags & NC_VarSelect ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      nPk = 1;
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }
  
    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0, wcf, iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
  
    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }
  
    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }
  
    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
    }
  
    /* If this DELETE cannot use the ONEPASS strategy, this is the 
    ** end of the WHERE loop */
    if( eOnePass!=ONEPASS_OFF ){
      addrBypass = sqlite3VdbeMakeLabel(v);
    }else{
      sqlite3WhereEnd(pWInfo);
    }
  
    /* Unless this is a view, open cursors for the table we are 
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF 
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ) sqlite3VdbeJumpHere(v, iAddrOnce);
    }
  
    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || pTab->pSelect!=0 );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }  
  
    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }
  
    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }     
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, memCnt, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows deleted", SQLITE_STATIC);
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) 
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  sqlite3DbFree(db, aToOpen);
  return;
}